

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# def_to_proto.c
# Opt level: O3

google_protobuf_ServiceDescriptorProto *
servicedef_toproto(upb_ToProto_Context *ctx,upb_ServiceDef *s)

{
  upb_Arena *puVar1;
  undefined8 buf;
  _Bool _Var2;
  int iVar3;
  upb_DecodeStatus uVar4;
  char *__s;
  size_t sVar5;
  void *pvVar6;
  upb_MethodDef *m;
  google_protobuf_MethodDescriptorProto *pgVar7;
  google_protobuf_ServiceOptions *msg;
  google_protobuf_ServiceDescriptorProto *msg_00;
  anon_union_8_2_9eb4e620_for_upb_Message_0 msg_01;
  size_t sVar8;
  upb_StringView uVar9;
  size_t size;
  upb_MiniTableField field;
  size_t local_48;
  upb_MiniTableField local_40;
  
  puVar1 = ctx->arena;
  msg_00 = (google_protobuf_ServiceDescriptorProto *)puVar1->ptr_dont_copy_me__upb_internal_use_only
  ;
  if ((ulong)((long)puVar1->end_dont_copy_me__upb_internal_use_only - (long)msg_00) < 0x30) {
    msg_00 = (google_protobuf_ServiceDescriptorProto *)
             _upb_Arena_SlowMalloc_dont_copy_me__upb_internal_use_only(puVar1,0x30);
  }
  else {
    if ((google_protobuf_ServiceDescriptorProto *)
        ((ulong)((long)&(msg_00->base_dont_copy_me__upb_internal_use_only).field_0 + 7U) &
        0xfffffffffffffff8) != msg_00) goto LAB_0027eba2;
    puVar1->ptr_dont_copy_me__upb_internal_use_only = (char *)(msg_00 + 6);
  }
  if (msg_00 != (google_protobuf_ServiceDescriptorProto *)0x0) {
    memset(msg_00,0,0x30);
    __s = upb_ServiceDef_Name(s);
    sVar5 = strlen(__s);
    uVar9.size = sVar5;
    uVar9.data = __s;
    uVar9 = strviewdup2(ctx,uVar9);
    if (((ulong)(msg_00->base_dont_copy_me__upb_internal_use_only).field_0 & 1) != 0) {
LAB_0027ebc1:
      __assert_fail("!upb_Message_IsFrozen(msg)",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/internal/accessors.h"
                    ,0x13b,
                    "void upb_Message_SetBaseField(struct upb_Message *, const upb_MiniTableField *, const void *)"
                   );
    }
    *(byte *)&msg_00[1].base_dont_copy_me__upb_internal_use_only.field_0 =
         *(byte *)&msg_00[1].base_dont_copy_me__upb_internal_use_only.field_0 | 1;
    *(upb_StringView *)(msg_00 + 2) = uVar9;
    iVar3 = upb_ServiceDef_MethodCount(s);
    local_40._0_8_ = (char *)0x2000000002;
    local_40.submsg_index_dont_copy_me__upb_internal_use_only = 0;
    local_40.descriptortype_dont_copy_me__upb_internal_use_only = '\v';
    local_40.mode_dont_copy_me__upb_internal_use_only = 0xc1;
    pvVar6 = upb_Message_ResizeArrayUninitialized
                       (&msg_00->base_dont_copy_me__upb_internal_use_only,&local_40,(long)iVar3,
                        ctx->arena);
    if (iVar3 != 0) {
      sVar8 = 0;
      do {
        m = upb_ServiceDef_Method(s,(int)sVar8);
        pgVar7 = methoddef_toproto(ctx,m);
        *(google_protobuf_MethodDescriptorProto **)((long)pvVar6 + sVar8 * 8) = pgVar7;
        sVar8 = sVar8 + 1;
      } while ((long)iVar3 != sVar8);
    }
    _Var2 = upb_ServiceDef_HasOptions(s);
    if (!_Var2) {
      return msg_00;
    }
    msg = upb_ServiceDef_Options(s);
    upb_Encode(&msg->base_dont_copy_me__upb_internal_use_only,
               &google__protobuf__ServiceOptions_msg_init,0,ctx->arena,(char **)&local_40,&local_48)
    ;
    buf = local_40._0_8_;
    if ((char *)local_40._0_8_ != (char *)0x0) {
      puVar1 = ctx->arena;
      msg_01.internal_opaque = (uintptr_t)puVar1->ptr_dont_copy_me__upb_internal_use_only;
      if ((ulong)((long)puVar1->end_dont_copy_me__upb_internal_use_only - (long)msg_01) < 0x20) {
        msg_01 = (anon_union_8_2_9eb4e620_for_upb_Message_0)
                 _upb_Arena_SlowMalloc_dont_copy_me__upb_internal_use_only(puVar1,0x20);
      }
      else {
        if ((char *)((ulong)(msg_01.internal_opaque + 7) & 0xfffffffffffffff8) !=
            (char *)msg_01.internal_opaque) {
LAB_0027eba2:
          __assert_fail("((((uintptr_t)ret) + (8) - 1) / (8) * (8)) == (uintptr_t)ret",
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/mem/internal/arena.h"
                        ,0x3b,"void *upb_Arena_Malloc(struct upb_Arena *, size_t)");
        }
        puVar1->ptr_dont_copy_me__upb_internal_use_only = (char *)(msg_01.internal_opaque + 0x20);
      }
      if ((anon_union_8_2_9eb4e620_for_upb_Message_0)msg_01.internal_opaque !=
          (anon_union_8_2_9eb4e620_for_upb_Message_0)0x0) {
        memset((void *)msg_01,0,0x20);
        uVar4 = upb_Decode((char *)buf,local_48,(upb_Message *)msg_01,
                           &google__protobuf__ServiceOptions_msg_init,(upb_ExtensionRegistry *)0x0,0
                           ,puVar1);
        if (uVar4 == kUpb_DecodeStatus_Ok) {
          if (((ulong)(msg_00->base_dont_copy_me__upb_internal_use_only).field_0 & 1) == 0) {
            *(byte *)&msg_00[1].base_dont_copy_me__upb_internal_use_only.field_0 =
                 *(byte *)&msg_00[1].base_dont_copy_me__upb_internal_use_only.field_0 | 2;
            *(anon_union_8_2_9eb4e620_for_upb_Message_0 *)(msg_00 + 5) = msg_01;
            return msg_00;
          }
          goto LAB_0027ebc1;
        }
      }
    }
  }
  siglongjmp((__jmp_buf_tag *)ctx->err,1);
}

Assistant:

static google_protobuf_ServiceDescriptorProto* servicedef_toproto(
    upb_ToProto_Context* ctx, const upb_ServiceDef* s) {
  google_protobuf_ServiceDescriptorProto* proto =
      google_protobuf_ServiceDescriptorProto_new(ctx->arena);
  CHK_OOM(proto);

  google_protobuf_ServiceDescriptorProto_set_name(
      proto, strviewdup(ctx, upb_ServiceDef_Name(s)));

  size_t n = upb_ServiceDef_MethodCount(s);
  google_protobuf_MethodDescriptorProto** methods =
      google_protobuf_ServiceDescriptorProto_resize_method(proto, n, ctx->arena);
  for (size_t i = 0; i < n; i++) {
    methods[i] = methoddef_toproto(ctx, upb_ServiceDef_Method(s, i));
  }

  if (upb_ServiceDef_HasOptions(s)) {
    SET_OPTIONS(proto, ServiceDescriptorProto, ServiceOptions,
                upb_ServiceDef_Options(s));
  }

  return proto;
}